

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O3

int xmlSchemaParseUInt(xmlChar **str,unsigned_long *llo,unsigned_long *lmi,unsigned_long *lhi)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  unsigned_long uVar4;
  int iVar5;
  byte *pbVar6;
  unsigned_long uVar7;
  uint uVar8;
  unsigned_long uVar9;
  uint uVar10;
  byte *pbVar11;
  
  pbVar3 = *str;
  if (9 < (byte)(*pbVar3 - 0x30)) {
    return -2;
  }
  if (*pbVar3 == 0x30) {
    do {
      pbVar11 = pbVar3 + 1;
      pbVar3 = pbVar3 + 1;
    } while (*pbVar11 == 0x30);
    if (9 < (byte)(*pbVar11 - 0x30)) {
      uVar7 = 0;
      uVar2 = 0;
      uVar4 = 0;
      uVar9 = 0;
      goto LAB_001cd2d5;
    }
  }
  pbVar11 = pbVar3;
  uVar10 = 0xffffffff;
  do {
    uVar2 = uVar10;
    pbVar6 = pbVar11;
    uVar10 = uVar2 + 1;
    pbVar11 = pbVar6 + 1;
  } while ((byte)(pbVar6[1] - 0x30) < 10);
  if (0x17 < uVar10) {
    *str = pbVar6 + 1;
    return -1;
  }
  uVar2 = uVar2 + 2;
  uVar4 = 0;
  uVar8 = uVar2;
  if (uVar10 < 0x10) {
    uVar7 = 0;
    if (7 < uVar10) goto LAB_001cd27c;
  }
  else {
    do {
      bVar1 = *pbVar3;
      pbVar3 = pbVar3 + 1;
      uVar4 = ((ulong)bVar1 + uVar4 * 10) - 0x30;
      uVar8 = uVar8 - 1;
    } while (0x10 < uVar8);
    pbVar3 = pbVar6 + -0xf;
    uVar8 = 0x10;
LAB_001cd27c:
    iVar5 = uVar8 - 8;
    uVar7 = 0;
    pbVar11 = pbVar3;
    do {
      bVar1 = *pbVar11;
      pbVar11 = pbVar11 + 1;
      uVar7 = ((ulong)bVar1 + uVar7 * 10) - 0x30;
      uVar8 = uVar8 - 1;
    } while (8 < uVar8);
    pbVar3 = pbVar3 + iVar5;
    uVar8 = 8;
  }
  uVar10 = uVar8 + 1;
  uVar9 = 0;
  pbVar11 = pbVar3;
  do {
    bVar1 = *pbVar11;
    pbVar11 = pbVar11 + 1;
    uVar9 = ((ulong)bVar1 + uVar9 * 10) - 0x30;
    uVar10 = uVar10 - 1;
  } while (1 < uVar10);
  pbVar3 = pbVar3 + uVar8;
LAB_001cd2d5:
  *str = pbVar3;
  *llo = uVar9;
  *lmi = uVar7;
  *lhi = uVar4;
  return uVar2;
}

Assistant:

static int
xmlSchemaParseUInt(const xmlChar **str, unsigned long *llo,
                   unsigned long *lmi, unsigned long *lhi) {
    unsigned long lo = 0, mi = 0, hi = 0;
    const xmlChar *tmp, *cur = *str;
    int ret = 0, i = 0;

    if (!((*cur >= '0') && (*cur <= '9')))
        return(-2);

    while (*cur == '0') {        /* ignore leading zeroes */
        cur++;
    }
    tmp = cur;
    while ((*tmp != 0) && (*tmp >= '0') && (*tmp <= '9')) {
        i++;tmp++;ret++;
    }
    if (i > 24) {
        *str = tmp;
        return(-1);
    }
    while (i > 16) {
        hi = hi * 10 + (*cur++ - '0');
        i--;
    }
    while (i > 8) {
        mi = mi * 10 + (*cur++ - '0');
        i--;
    }
    while (i > 0) {
        lo = lo * 10 + (*cur++ - '0');
        i--;
    }

    *str = cur;
    *llo = lo;
    *lmi = mi;
    *lhi = hi;
    return(ret);
}